

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,uv_membership membership)

{
  int iVar1;
  undefined1 local_5c [8];
  sockaddr_in6 addr6;
  sockaddr_in addr4;
  int err;
  uv_membership membership_local;
  char *interface_addr_local;
  char *multicast_addr_local;
  uv_udp_t *handle_local;
  
  iVar1 = uv_ip4_addr(multicast_addr,0,(sockaddr_in *)((long)&addr6.sin6_addr.__in6_u + 0xc));
  if (iVar1 == 0) {
    handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,2,4);
    if (handle_local._4_4_ == 0) {
      handle_local._4_4_ =
           uv__udp_set_membership4
                     (handle,(sockaddr_in *)((long)&addr6.sin6_addr.__in6_u + 0xc),interface_addr,
                      membership);
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,(sockaddr_in6 *)local_5c);
    if (iVar1 == 0) {
      handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,10,4);
      if (handle_local._4_4_ == 0) {
        handle_local._4_4_ =
             uv__udp_set_membership6(handle,(sockaddr_in6 *)local_5c,interface_addr,membership);
      }
    }
    else {
      handle_local._4_4_ = -0x16;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_set_membership(uv_udp_t* handle,
                          const char* multicast_addr,
                          const char* interface_addr,
                          uv_membership membership) {
  int err;
  struct sockaddr_in addr4;
  struct sockaddr_in6 addr6;

  if (uv_ip4_addr(multicast_addr, 0, &addr4) == 0) {
    err = uv__udp_maybe_deferred_bind(handle, AF_INET, UV_UDP_REUSEADDR);
    if (err)
      return err;
    return uv__udp_set_membership4(handle, &addr4, interface_addr, membership);
  } else if (uv_ip6_addr(multicast_addr, 0, &addr6) == 0) {
    err = uv__udp_maybe_deferred_bind(handle, AF_INET6, UV_UDP_REUSEADDR);
    if (err)
      return err;
    return uv__udp_set_membership6(handle, &addr6, interface_addr, membership);
  } else {
    return -EINVAL;
  }
}